

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O3

void jsons_print_includes(lyout *out,lys_include *inc,uint8_t inc_size,int *first)

{
  undefined7 in_register_00000011;
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  int local_34 [2];
  int f;
  
  if ((int)CONCAT71(in_register_00000011,inc_size) != 0) {
    ly_print(out,"%s\"include\":{",",");
    lVar3 = 0;
    do {
      pcVar1 = ",";
      if (lVar3 == 0) {
        pcVar1 = "";
      }
      pcVar2 = "@";
      if (inc->rev[lVar3] == '\0') {
        pcVar2 = "";
      }
      ly_print(out,"%s\"%s%s%s\":{",pcVar1,*(undefined8 *)(*(long *)(inc->rev + lVar3 + -8) + 8),
               pcVar2,inc->rev + lVar3);
      local_34[0] = 1;
      jsons_print_text(out,"description","text",*(char **)(inc->rev + lVar3 + 0x18),1,local_34);
      jsons_print_text(out,"reference","text",*(char **)(inc->rev + lVar3 + 0x20),1,local_34);
      ly_print(out,"}");
      lVar3 = lVar3 + 0x30;
    } while ((ulong)inc_size * 0x30 != lVar3);
    ly_print(out,"}");
  }
  return;
}

Assistant:

static void
jsons_print_includes(struct lyout *out, const struct lys_include *inc, uint8_t inc_size, int *first)
{
    int i, f;

    if (!inc_size) {
        return;
    }

    ly_print(out, "%s\"include\":{", (first && (*first)) ? "" : ",");
    for (i = 0; i < inc_size; ++i) {
        ly_print(out, "%s\"%s%s%s\":{", i ? "," : "", inc[i].submodule->name,
                 inc[i].rev[0] ? "@" : "", inc[i].rev);
        f = 1;
        jsons_print_text(out, "description", "text", inc[i].dsc, 1, &f);
        jsons_print_text(out, "reference", "text", inc[i].ref, 1, &f);
        ly_print(out, "}");
    }
    ly_print(out, "}");
    if (first) {
        (*first) = 0;
    }
}